

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dup.cc
# Opt level: O1

void * ASN1_item_dup(ASN1_ITEM *it,void *x)

{
  int iVar1;
  ASN1_VALUE *pAVar2;
  uchar *b;
  uchar *p;
  uchar *local_20;
  uchar *local_18;
  
  local_20 = (uchar *)0x0;
  if ((x != (void *)0x0) &&
     (iVar1 = ASN1_item_i2d((ASN1_VALUE *)x,&local_20,it), local_20 != (uchar *)0x0)) {
    local_18 = local_20;
    pAVar2 = ASN1_item_d2i((ASN1_VALUE **)0x0,&local_18,(long)iVar1,it);
    OPENSSL_free(local_20);
    return pAVar2;
  }
  return (void *)0x0;
}

Assistant:

void *ASN1_item_dup(const ASN1_ITEM *it, void *x) {
  unsigned char *b = NULL;
  const unsigned char *p;
  long i;
  void *ret;

  if (x == NULL) {
    return NULL;
  }

  i = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(x), &b, it);
  if (b == NULL) {
    return NULL;
  }
  p = b;
  ret = ASN1_item_d2i(NULL, &p, i, it);
  OPENSSL_free(b);
  return ret;
}